

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

SMatrix<double,_3,_3> * gmath::transpose<double,3,3>(SMatrix<double,_3,_3> *a)

{
  double *pdVar1;
  SMatrix<double,_3,_3> *in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  double dVar2;
  int i;
  int k;
  SMatrix<double,_3,_3> *ret;
  undefined4 local_18;
  undefined4 local_14;
  
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      dVar2 = SMatrix<double,_3,_3>::operator()(in_RSI,local_18,local_14);
      pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,local_14,local_18);
      *pdVar1 = dVar2;
    }
  }
  return in_RDI;
}

Assistant:

inline SMatrix<T, nrows, ncols> transpose(
  const SMatrix<T, ncols, nrows> &a)
{
  SMatrix<T, nrows, ncols> ret;

  for (int k=0; k<nrows; k++)
    for (int i=0; i<ncols; i++)
    {
      ret(k, i)=a(i, k);
    }

  return ret;
}